

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::handleColorData
          (LibraryEffectsLoader *this,float *data,size_t length,Color *color)

{
  Color *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    switch(*(undefined8 *)(in_RDI + 400)) {
    case 0:
      COLLADAFW::Color::setRed(in_RCX,(double)*(float *)(in_RSI + local_28 * 4));
      break;
    case 1:
      COLLADAFW::Color::setGreen(in_RCX,(double)*(float *)(in_RSI + local_28 * 4));
      break;
    case 2:
      COLLADAFW::Color::setBlue(in_RCX,(double)*(float *)(in_RSI + local_28 * 4));
      break;
    case 3:
      COLLADAFW::Color::setAlpha(in_RCX,(double)*(float *)(in_RSI + local_28 * 4));
    }
    *(long *)(in_RDI + 400) = *(long *)(in_RDI + 400) + 1;
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::handleColorData( const float* data, size_t length, COLLADAFW::Color& color )
	{
		for ( size_t i = 0; i < length; ++i)
		{
			switch ( mCurrentColorValueIndex )
			{
			case 0:
				color.setRed(data[i]);
				break;
			case 1:
				color.setGreen(data[i]);
				break;
			case 2:
				color.setBlue(data[i]);
				break;
			case 3:
				color.setAlpha(data[i]);
				break;
			}
			mCurrentColorValueIndex++;
		}
		return true;
	}